

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmcode.cpp
# Opt level: O2

opcode * assembler::anon_unknown_0::make_opcode
                   (opcode *__return_storage_ptr__,uint8_t prefix,string *mnemonic,uint64_t flags,
                   uint8_t opcode_id,uint8_t opcode_id_2,opcode_operand_type op1,
                   opcode_operand_type op2,uint8_t postfix)

{
  (__return_storage_ptr__->mnemonic)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mnemonic).field_2;
  (__return_storage_ptr__->mnemonic)._M_string_length = 0;
  (__return_storage_ptr__->mnemonic).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->prefix = 'f';
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->mnemonic);
  __return_storage_ptr__->flags = 0x402;
  __return_storage_ptr__->opcode_id = '\x0f';
  __return_storage_ptr__->opcode_id_2 = 0xc2;
  __return_storage_ptr__->operand_1 = xmm;
  __return_storage_ptr__->operand_2 = xmm_m128;
  __return_storage_ptr__->operand_3 = none;
  __return_storage_ptr__->use_postfix = true;
  __return_storage_ptr__->postfix = (uint8_t)mnemonic;
  return __return_storage_ptr__;
}

Assistant:

opcode make_opcode(uint8_t prefix, std::string mnemonic, uint64_t flags, uint8_t opcode_id, uint8_t opcode_id_2, opcode::opcode_operand_type op1, opcode::opcode_operand_type op2, uint8_t postfix)
    {
    opcode o;
    o.prefix = prefix;
    o.mnemonic = mnemonic;
    o.flags = flags;
    o.opcode_id = opcode_id;
    o.opcode_id_2 = opcode_id_2;
    o.operand_1 = op1;
    o.operand_2 = op2;
    o.operand_3 = opcode::none;
    o.use_postfix = true;
    o.postfix = postfix;
    return o;
    }